

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::ignore_case<CLI::App>(Option *this,bool value)

{
  bool bVar1;
  reference __lhs;
  pointer pOVar2;
  string *__rhs;
  ulong uVar3;
  undefined8 uVar4;
  byte in_SIL;
  pointer in_RDI;
  string *omatch;
  Option_p *opt;
  iterator __end0;
  iterator __begin0;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range3;
  App *parent;
  Option *in_stack_00000220;
  Option *in_stack_00000228;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffb8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_28;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *local_20;
  App *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if ((((in_RDI->super_OptionBase<CLI::Option>).ignore_case_ & 1U) == 0) && ((bool)local_9 != false)
     ) {
    (in_RDI->super_OptionBase<CLI::Option>).ignore_case_ = (bool)local_9;
    local_18 = in_RDI->parent_;
    local_20 = &local_18->options_;
    local_28._M_current =
         (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
         std::
         vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ::begin(in_stack_ffffffffffffff78);
    std::
    vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
    ::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffff80,
                              (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      __lhs = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&local_28);
      pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get
                         ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                          in_stack_ffffffffffffff80);
      if (pOVar2 != in_RDI) {
        std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                  ((unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)0x15127d);
        __rhs = matching_name_abi_cxx11_(in_stack_00000228,in_stack_00000220);
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          (in_RDI->super_OptionBase<CLI::Option>).ignore_case_ = false;
          uVar4 = __cxa_allocate_exception(0x38);
          ::std::operator+((char *)__lhs,__rhs);
          OptionAlreadyAdded::OptionAlreadyAdded
                    ((OptionAlreadyAdded *)__rhs,in_stack_ffffffffffffffb8);
          __cxa_throw(uVar4,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
      ::operator++(&local_28);
    }
  }
  else {
    (in_RDI->super_OptionBase<CLI::Option>).ignore_case_ = (bool)local_9;
  }
  return in_RDI;
}

Assistant:

Option *Option::ignore_case(bool value) {
    if(!ignore_case_ && value) {
        ignore_case_ = value;
        auto *parent = static_cast<T *>(parent_);
        for(const Option_p &opt : parent->options_) {
            if(opt.get() == this) {
                continue;
            }
            const auto &omatch = opt->matching_name(*this);
            if(!omatch.empty()) {
                ignore_case_ = false;
                throw OptionAlreadyAdded("adding ignore case caused a name conflict with " + omatch);
            }
        }
    } else {
        ignore_case_ = value;
    }
    return this;
}